

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

void glfwGetMonitorPos(GLFWmonitor *handle,int *xpos,int *ypos)

{
  _GLFWmonitor *monitor;
  int *ypos_local;
  int *xpos_local;
  GLFWmonitor *handle_local;
  
  if (handle != (GLFWmonitor *)0x0) {
    if (xpos != (int *)0x0) {
      *xpos = 0;
    }
    if (ypos != (int *)0x0) {
      *ypos = 0;
    }
    if (_glfwInitialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
    }
    else {
      _glfwPlatformGetMonitorPos((_GLFWmonitor *)handle,xpos,ypos);
    }
    return;
  }
  __assert_fail("monitor != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Wei-Parker-Guo[P]PhongSphere/glfw-3.2.1/src/monitor.c"
                ,0x148,"void glfwGetMonitorPos(GLFWmonitor *, int *, int *)");
}

Assistant:

GLFWAPI void glfwGetMonitorPos(GLFWmonitor* handle, int* xpos, int* ypos)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;
    assert(monitor != NULL);

    if (xpos)
        *xpos = 0;
    if (ypos)
        *ypos = 0;

    _GLFW_REQUIRE_INIT();

    _glfwPlatformGetMonitorPos(monitor, xpos, ypos);
}